

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveVCProcess.cpp
# Opt level: O0

void ArrayDelete<aiTexture>(aiTexture ***in,uint *num)

{
  aiTexture *this;
  uint local_1c;
  uint i;
  uint *num_local;
  aiTexture ***in_local;
  
  for (local_1c = 0; local_1c < *num; local_1c = local_1c + 1) {
    this = (*in)[local_1c];
    if (this != (aiTexture *)0x0) {
      aiTexture::~aiTexture(this);
      operator_delete(this);
    }
  }
  if (*in != (aiTexture **)0x0) {
    operator_delete__(*in);
  }
  *in = (aiTexture **)0x0;
  *num = 0;
  return;
}

Assistant:

inline void ArrayDelete(T**& in, unsigned int& num)
{
    for (unsigned int i = 0; i < num; ++i)
        delete in[i];

    delete[] in;
    in = NULL;
    num = 0;
}